

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool __thiscall inja::Parser::parse_statement(Parser *this,Template *tmpl,Kind closing,path *path)

{
  Token *this_00;
  BlockNode **__args;
  size_t __n;
  int *__s1;
  IfStatementNode **ppIVar1;
  IfStatementNode *pIVar2;
  BlockNode *pBVar3;
  size_t sVar4;
  char *pcVar5;
  pointer pcVar6;
  size_t sVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sVar10;
  undefined8 uVar11;
  bool bVar12;
  int iVar13;
  long *plVar14;
  ParserError *pPVar15;
  long *plVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  _Elt_pointer ppFVar18;
  _Elt_pointer ppBVar19;
  _Elt_pointer ppIVar20;
  Template *pTVar21;
  size_type __rlen;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>,_bool>
  pVar22;
  SourceLocation SVar23;
  string key;
  shared_ptr<inja::BlockStatementNode> block_statement_node;
  shared_ptr<inja::SetStatementNode> set_statement_node;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  Template *local_78;
  undefined1 local_69;
  undefined1 local_68 [32];
  shared_ptr<inja::SetStatementNode> local_48;
  char *local_38;
  
  if ((this->tok).kind != Id) {
    return false;
  }
  __n = (this->tok).text._M_len;
  if (6 < __n - 2) {
    return false;
  }
  this_00 = &this->tok;
  __s1 = (int *)(this->tok).text._M_str;
  local_78 = tmpl;
  switch(__n) {
  case 2:
    if ((short)*__s1 != 0x6669) {
      return false;
    }
    if (this->have_peek_tok == true) {
      (this->tok).text._M_str = (this->peek_tok).text._M_str;
      uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
      sVar4 = (this->peek_tok).text._M_len;
      this_00->kind = (this->peek_tok).kind;
      *(undefined4 *)&this_00->field_0x4 = uVar8;
      (this->tok).text._M_len = sVar4;
      this->have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_d8,&this->lexer);
      (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_d8._M_dataplus._M_p;
      (this->tok).text._M_len = local_d8._M_string_length;
    }
    pTVar21 = local_78;
    pcVar5 = (this->tok).text._M_str;
    pcVar6 = (local_78->content)._M_dataplus._M_p;
    local_d8._M_string_length = (size_type)operator_new(0xa0);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001af628;
    local_d8._M_dataplus._M_p = (pointer)(local_d8._M_string_length + 0x10);
    pBVar3 = this->current_block;
    *(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x10))->
              _M_use_count = (long)pcVar5 - (long)pcVar6;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x10))->
    _vptr__Sp_counted_base = (_func_int **)&PTR_accept_001af678;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x20))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x20))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x20))->
    _vptr__Sp_counted_base = (_func_int **)&PTR_accept_001af6d0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x30))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x30))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x30))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x40))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x40))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x40))->
    _vptr__Sp_counted_base = (_func_int **)&PTR_accept_001af120;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x60))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x50))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x50))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x50))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x70))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined ***)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x60))->
      _M_use_count = &PTR_accept_001af120;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x80))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x80))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x70))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x70))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x80))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x90))->
    _vptr__Sp_counted_base = (_func_int **)pBVar3;
    *(undefined2 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x90))->
      _M_use_count = 0;
    ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
    emplace_back<std::shared_ptr<inja::IfStatementNode>&>
              ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                *)&pBVar3->nodes,(shared_ptr<inja::IfStatementNode> *)&local_d8);
    local_b8._M_dataplus._M_p = local_d8._M_dataplus._M_p;
    ::std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>::
    emplace_back<inja::IfStatementNode*>
              ((deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>> *)
               &this->if_statement_stack,(IfStatementNode **)&local_b8);
    this->current_block = (BlockNode *)(local_d8._M_dataplus._M_p + 0x30);
    this->current_expression_list = (ExpressionListNode *)(local_d8._M_dataplus._M_p + 0x10);
    bVar12 = parse_expression(this,pTVar21,closing);
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length;
    break;
  case 3:
    iVar13 = bcmp(__s1,"for",__n);
    if (iVar13 != 0) {
      iVar13 = bcmp(__s1,"set",__n);
      if (iVar13 != 0) {
        return false;
      }
      if (this->have_peek_tok == true) {
        (this->tok).text._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        this_00->kind = (this->peek_tok).kind;
        *(undefined4 *)&this_00->field_0x4 = uVar8;
        (this->tok).text._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_d8,&this->lexer);
        (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
        *(pointer *)this_00 = local_d8._M_dataplus._M_p;
        (this->tok).text._M_len = local_d8._M_string_length;
      }
      pTVar21 = local_78;
      if (this_00->kind != Id) {
        Token::describe_abi_cxx11_(&local_98,this_00);
        ::std::operator+(&local_b8,"expected variable name, got \'",&local_98);
        plVar14 = (long *)::std::__cxx11::string::append((char *)&local_b8);
        plVar16 = plVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar16) {
          local_d8.field_2._M_allocated_capacity = *plVar16;
          local_d8.field_2._8_8_ = plVar14[3];
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *plVar16;
          local_d8._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_d8._M_string_length = plVar14[1];
        *plVar14 = (long)plVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        throw_parser_error(this,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          (ulong)(local_d8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          (ulong)(local_b8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar5 = (this->tok).text._M_str;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,pcVar5,pcVar5 + (this->tok).text._M_len);
      if (this->have_peek_tok == true) {
        (this->tok).text._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        this_00->kind = (this->peek_tok).kind;
        *(undefined4 *)&this_00->field_0x4 = uVar8;
        (this->tok).text._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_b8,&this->lexer);
        (this->tok).text._M_str = (char *)local_b8.field_2._M_allocated_capacity;
        *(pointer *)this_00 = local_b8._M_dataplus._M_p;
        (this->tok).text._M_len = local_b8._M_string_length;
      }
      local_b8._M_dataplus._M_p =
           (this->tok).text._M_str + -(long)(pTVar21->content)._M_dataplus._M_p;
      local_48.super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<inja::SetStatementNode,std::allocator<inja::SetStatementNode>,std::__cxx11::string_const&,long>
                (&local_48.super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(SetStatementNode **)&local_48,
                 (allocator<inja::SetStatementNode> *)&local_98,&local_d8,(long *)&local_b8);
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::SetStatementNode>&>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&this->current_block->nodes,&local_48);
      this->current_expression_list =
           &(local_48.super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->expression;
      if (((this->tok).text._M_len != 1) || (*(this->tok).text._M_str != '=')) {
        Token::describe_abi_cxx11_((string *)local_68,this_00);
        ::std::operator+(&local_98,"expected \'=\', got \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68);
        plVar14 = (long *)::std::__cxx11::string::append((char *)&local_98);
        plVar16 = plVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar16) {
          local_b8.field_2._M_allocated_capacity = *plVar16;
          local_b8.field_2._8_8_ = plVar14[3];
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *plVar16;
          local_b8._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_b8._M_string_length = plVar14[1];
        *plVar14 = (long)plVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        throw_parser_error(this,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          (ulong)(local_b8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((element_type *)local_68._0_8_ != (element_type *)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
      }
      if (this->have_peek_tok == true) {
        (this->tok).text._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        this_00->kind = (this->peek_tok).kind;
        *(undefined4 *)&this_00->field_0x4 = uVar8;
        (this->tok).text._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_b8,&this->lexer);
        (this->tok).text._M_str = (char *)local_b8.field_2._M_allocated_capacity;
        *(pointer *)this_00 = local_b8._M_dataplus._M_p;
        (this->tok).text._M_len = local_b8._M_string_length;
      }
      bVar12 = parse_expression(this,pTVar21,closing);
      if (local_48.super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      goto LAB_00162335;
    }
    if (this->have_peek_tok == true) {
      (this->tok).text._M_str = (this->peek_tok).text._M_str;
      uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
      sVar4 = (this->peek_tok).text._M_len;
      this_00->kind = (this->peek_tok).kind;
      *(undefined4 *)&this_00->field_0x4 = uVar8;
      (this->tok).text._M_len = sVar4;
      this->have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_d8,&this->lexer);
      (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_d8._M_dataplus._M_p;
      (this->tok).text._M_len = local_d8._M_string_length;
    }
    if (this_00->kind != Id) {
      Token::describe_abi_cxx11_(&local_98,this_00);
      ::std::operator+(&local_b8,"expected id, got \'",&local_98);
      plVar14 = (long *)::std::__cxx11::string::append((char *)&local_b8);
      plVar16 = plVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar16) {
        local_d8.field_2._M_allocated_capacity = *plVar16;
        local_d8.field_2._8_8_ = plVar14[3];
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *plVar16;
        local_d8._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_d8._M_string_length = plVar14[1];
      *plVar14 = (long)plVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      throw_parser_error(this,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        (ulong)(local_b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    sVar4 = (this->tok).text._M_len;
    local_38 = (this->tok).text._M_str;
    if (this->have_peek_tok == true) {
      (this->tok).text._M_str = (this->peek_tok).text._M_str;
      uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
      sVar7 = (this->peek_tok).text._M_len;
      this_00->kind = (this->peek_tok).kind;
      *(undefined4 *)&this_00->field_0x4 = uVar8;
      (this->tok).text._M_len = sVar7;
      this->have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_d8,&this->lexer);
      (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_d8._M_dataplus._M_p;
      (this->tok).text._M_len = local_d8._M_string_length;
    }
    local_68._0_8_ = (element_type *)0x0;
    local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00->kind == Comma) {
      if (this->have_peek_tok == true) {
        (this->tok).text._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar7 = (this->peek_tok).text._M_len;
        this_00->kind = (this->peek_tok).kind;
        *(undefined4 *)&this_00->field_0x4 = uVar8;
        (this->tok).text._M_len = sVar7;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_d8,&this->lexer);
        (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
        *(pointer *)this_00 = local_d8._M_dataplus._M_p;
        (this->tok).text._M_len = local_d8._M_string_length;
      }
      if (this_00->kind != Id) {
        Token::describe_abi_cxx11_(&local_98,this_00);
        ::std::operator+(&local_b8,"expected id, got \'",&local_98);
        plVar14 = (long *)::std::__cxx11::string::append((char *)&local_b8);
        plVar16 = plVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar16) {
          local_d8.field_2._M_allocated_capacity = *plVar16;
          local_d8.field_2._8_8_ = plVar14[3];
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *plVar16;
          local_d8._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_d8._M_string_length = plVar14[1];
        *plVar14 = (long)plVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        throw_parser_error(this,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          (ulong)(local_d8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          (ulong)(local_b8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      sVar7 = (this->tok).text._M_len;
      pcVar5 = (this->tok).text._M_str;
      if (this->have_peek_tok == true) {
        (this->tok).text._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar10 = (this->peek_tok).text._M_len;
        uVar9 = *(undefined4 *)((long)&(this->peek_tok).text._M_len + 4);
        this_00->kind = (this->peek_tok).kind;
        *(undefined4 *)&(this->tok).field_0x4 = uVar8;
        *(int *)&(this->tok).text._M_len = (int)sVar10;
        *(undefined4 *)((long)&(this->tok).text._M_len + 4) = uVar9;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_d8,&this->lexer);
        (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
        this_00->kind = (Kind)local_d8._M_dataplus._M_p;
        *(undefined4 *)&(this->tok).field_0x4 = local_d8._M_dataplus._M_p._4_4_;
        *(undefined4 *)&(this->tok).text._M_len = (undefined4)local_d8._M_string_length;
        *(undefined4 *)((long)&(this->tok).text._M_len + 4) = local_d8._M_string_length._4_4_;
      }
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,local_38,local_38 + sVar4);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pcVar5,pcVar5 + sVar7);
      local_48.super___shared_ptr<inja::SetStatementNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((this->tok).text._M_str + -(long)(local_78->content)._M_dataplus._M_p);
      local_98._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<inja::ForObjectStatementNode,std::allocator<inja::ForObjectStatementNode>,std::__cxx11::string,std::__cxx11::string,inja::BlockNode*&,long>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length,
                 (ForObjectStatementNode **)&local_98,
                 (allocator<inja::ForObjectStatementNode> *)&local_69,&local_d8,&local_b8,
                 &this->current_block,(long *)&local_48);
      uVar11 = local_68._8_8_;
      local_68._8_8_ = local_98._M_string_length;
      local_68._0_8_ = local_98._M_dataplus._M_p;
      local_98._M_dataplus._M_p = (char *)0x0;
      local_98._M_string_length = 0;
      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11 !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        (ulong)(local_b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
LAB_00161cbb:
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
    }
    else {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,local_38,local_38 + sVar4);
      local_98._M_dataplus._M_p =
           (this->tok).text._M_str + -(long)(local_78->content)._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<inja::ForArrayStatementNode,std::allocator<inja::ForArrayStatementNode>,std::__cxx11::string,inja::BlockNode*&,long>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length,
                 (ForArrayStatementNode **)&local_b8,
                 (allocator<inja::ForArrayStatementNode> *)&local_48,&local_d8,&this->current_block,
                 (long *)&local_98);
      uVar11 = local_68._8_8_;
      local_68._8_8_ = local_b8._M_string_length;
      local_68._0_8_ = local_b8._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11 !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) goto LAB_00161cbb;
    }
    ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
    emplace_back<std::shared_ptr<inja::ForStatementNode>&>
              ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                *)&this->current_block->nodes,(shared_ptr<inja::ForStatementNode> *)local_68);
    local_d8._M_dataplus._M_p = (pointer)local_68._0_8_;
    ::std::deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>>::
    emplace_back<inja::ForStatementNode*>
              ((deque<inja::ForStatementNode*,std::allocator<inja::ForStatementNode*>> *)
               &this->for_statement_stack,(ForStatementNode **)&local_d8);
    pTVar21 = local_78;
    this->current_block = (BlockNode *)(local_68._0_8_ + 0x30);
    this->current_expression_list = (ExpressionListNode *)(local_68._0_8_ + 0x10);
    if ((((this->tok).kind != Id) || ((this->tok).text._M_len != 2)) ||
       (*(short *)(this->tok).text._M_str != 0x6e69)) {
      Token::describe_abi_cxx11_(&local_98,this_00);
      ::std::operator+(&local_b8,"expected \'in\', got \'",&local_98);
      plVar14 = (long *)::std::__cxx11::string::append((char *)&local_b8);
      p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar14 + 2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar14 == p_Var17) {
        local_d8.field_2._M_allocated_capacity = (size_type)p_Var17->_vptr__Sp_counted_base;
        local_d8.field_2._8_8_ = plVar14[3];
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = (size_type)p_Var17->_vptr__Sp_counted_base;
        local_d8._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_d8._M_string_length = plVar14[1];
      *plVar14 = (long)p_Var17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      throw_parser_error(this,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        (ulong)(local_b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    if (this->have_peek_tok == true) {
      (this->tok).text._M_str = (this->peek_tok).text._M_str;
      uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
      sVar4 = (this->peek_tok).text._M_len;
      this_00->kind = (this->peek_tok).kind;
      *(undefined4 *)&this_00->field_0x4 = uVar8;
      (this->tok).text._M_len = sVar4;
      this->have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_d8,&this->lexer);
      (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_d8._M_dataplus._M_p;
      (this->tok).text._M_len = local_d8._M_string_length;
      pTVar21 = local_78;
    }
    bVar12 = parse_expression(this,pTVar21,closing);
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
    break;
  case 4:
    iVar13 = bcmp(__s1,"else",__n);
    if (iVar13 != 0) {
      return false;
    }
    ppIVar20 = (this->if_statement_stack).c.
               super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppIVar20 ==
        (this->if_statement_stack).c.
        super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>._M_impl
        .super__Deque_impl_data._M_start._M_cur) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"else without matching if","");
      pPVar15 = (ParserError *)__cxa_allocate_exception(0x60);
      SVar23 = Lexer::current_position(&this->lexer);
      ParserError::ParserError(pPVar15,&local_d8,SVar23);
      __cxa_throw(pPVar15,&ParserError::typeinfo,InjaError::~InjaError);
    }
    if (ppIVar20 ==
        (this->if_statement_stack).c.
        super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>._M_impl
        .super__Deque_impl_data._M_finish._M_first) {
      ppIVar20 = (this->if_statement_stack).c.
                 super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (this->have_peek_tok == true) {
      (this->tok).text._M_str = (this->peek_tok).text._M_str;
      uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
      sVar4 = (this->peek_tok).text._M_len;
      this_00->kind = (this->peek_tok).kind;
      *(undefined4 *)&this_00->field_0x4 = uVar8;
      (this->tok).text._M_len = sVar4;
      this->have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_d8,&this->lexer);
      (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_d8._M_dataplus._M_p;
      (this->tok).text._M_len = local_d8._M_string_length;
    }
    pIVar2 = ppIVar20[-1];
    pIVar2->has_false_statement = true;
    this->current_block = &pIVar2->false_statement;
    if ((this->tok).kind != Id) {
      return true;
    }
    if ((this->tok).text._M_len != 2) {
      return true;
    }
    if (*(short *)(this->tok).text._M_str != 0x6669) {
      return true;
    }
    if (this->have_peek_tok == true) {
      (this->tok).text._M_str = (this->peek_tok).text._M_str;
      uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
      sVar4 = (this->peek_tok).text._M_len;
      this_00->kind = (this->peek_tok).kind;
      *(undefined4 *)&this_00->field_0x4 = uVar8;
      (this->tok).text._M_len = sVar4;
      this->have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_d8,&this->lexer);
      (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_d8._M_dataplus._M_p;
      (this->tok).text._M_len = local_d8._M_string_length;
    }
    pTVar21 = local_78;
    pcVar5 = (this->tok).text._M_str;
    pcVar6 = (local_78->content)._M_dataplus._M_p;
    local_d8._M_string_length = (size_type)operator_new(0xa0);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001af628;
    local_d8._M_dataplus._M_p = (pointer)(local_d8._M_string_length + 0x10);
    pBVar3 = this->current_block;
    *(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x10))->
              _M_use_count = (long)pcVar5 - (long)pcVar6;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x10))->
    _vptr__Sp_counted_base = (_func_int **)&PTR_accept_001af678;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x20))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x20))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x20))->
    _vptr__Sp_counted_base = (_func_int **)&PTR_accept_001af6d0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x30))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x30))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x30))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x40))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x40))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x40))->
    _vptr__Sp_counted_base = (_func_int **)&PTR_accept_001af120;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x60))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x50))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x50))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x50))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x70))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined ***)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x60))->
      _M_use_count = &PTR_accept_001af120;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x80))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x80))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x70))->
    _M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x70))->
    _M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x80))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x90))->
    _vptr__Sp_counted_base = (_func_int **)pBVar3;
    *(undefined2 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_string_length + 0x90))->
      _M_use_count = 1;
    ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
    emplace_back<std::shared_ptr<inja::IfStatementNode>&>
              ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                *)&pBVar3->nodes,(shared_ptr<inja::IfStatementNode> *)&local_d8);
    local_b8._M_dataplus._M_p = local_d8._M_dataplus._M_p;
    ::std::deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>>::
    emplace_back<inja::IfStatementNode*>
              ((deque<inja::IfStatementNode*,std::allocator<inja::IfStatementNode*>> *)
               &this->if_statement_stack,(IfStatementNode **)&local_b8);
    this->current_block = (BlockNode *)(local_d8._M_dataplus._M_p + 0x30);
    this->current_expression_list = (ExpressionListNode *)(local_d8._M_dataplus._M_p + 0x10);
    bVar12 = parse_expression(this,pTVar21,closing);
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length;
    break;
  case 5:
    iVar13 = bcmp(__s1,"endif",__n);
    if (iVar13 == 0) {
      ppIVar20 = (this->if_statement_stack).c.
                 super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppIVar20 ==
          (this->if_statement_stack).c.
          super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"endif without matching if","");
        pPVar15 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar23 = Lexer::current_position(&this->lexer);
        ParserError::ParserError(pPVar15,&local_d8,SVar23);
        __cxa_throw(pPVar15,&ParserError::typeinfo,InjaError::~InjaError);
      }
      do {
        if (ppIVar20 ==
            (this->if_statement_stack).c.
            super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppIVar1 = (this->if_statement_stack).c.
                    super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          if (ppIVar1[0x3f]->is_nested == false) {
            ppIVar20 = ppIVar1 + 0x40;
LAB_001618a1:
            if (this->have_peek_tok == true) {
              (this->tok).text._M_str = (this->peek_tok).text._M_str;
              uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
              sVar4 = (this->peek_tok).text._M_len;
              this_00->kind = (this->peek_tok).kind;
              *(undefined4 *)&this_00->field_0x4 = uVar8;
              (this->tok).text._M_len = sVar4;
              this->have_peek_tok = false;
            }
            else {
              Lexer::scan((Token *)&local_d8,&this->lexer);
              (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
              *(pointer *)this_00 = local_d8._M_dataplus._M_p;
              (this->tok).text._M_len = local_d8._M_string_length;
            }
            this->current_block = ppIVar20[-1]->parent;
            std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>::pop_back
                      (&(this->if_statement_stack).c);
            return true;
          }
        }
        else if (ppIVar20[-1]->is_nested != true) goto LAB_001618a1;
        std::deque<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>::pop_back
                  (&(this->if_statement_stack).c);
        ppIVar20 = (this->if_statement_stack).c.
                   super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      } while( true );
    }
    if ((char)__s1[1] != 'k' || *__s1 != 0x636f6c62) {
      return false;
    }
    if (this->have_peek_tok == true) {
      (this->tok).text._M_str = (this->peek_tok).text._M_str;
      uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
      sVar4 = (this->peek_tok).text._M_len;
      this_00->kind = (this->peek_tok).kind;
      *(undefined4 *)&this_00->field_0x4 = uVar8;
      (this->tok).text._M_len = sVar4;
      this->have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_d8,&this->lexer);
      (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_d8._M_dataplus._M_p;
      (this->tok).text._M_len = local_d8._M_string_length;
    }
    pTVar21 = local_78;
    if (this_00->kind != Id) {
      Token::describe_abi_cxx11_(&local_98,this_00);
      ::std::operator+(&local_b8,"expected block name, got \'",&local_98);
      plVar14 = (long *)::std::__cxx11::string::append((char *)&local_b8);
      plVar16 = plVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar16) {
        local_d8.field_2._M_allocated_capacity = *plVar16;
        local_d8.field_2._8_8_ = plVar14[3];
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *plVar16;
        local_d8._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_d8._M_string_length = plVar14[1];
      *plVar14 = (long)plVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      throw_parser_error(this,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        (ulong)(local_b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar5 = (this->tok).text._M_str;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,pcVar5,pcVar5 + (this->tok).text._M_len);
    __args = &this->current_block;
    local_b8._M_dataplus._M_p = (this->tok).text._M_str + -(long)(pTVar21->content)._M_dataplus._M_p
    ;
    local_68._0_8_ = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<inja::BlockStatementNode,std::allocator<inja::BlockStatementNode>,inja::BlockNode*&,std::__cxx11::string_const&,long>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8),
               (BlockStatementNode **)local_68,(allocator<inja::BlockStatementNode> *)&local_98,
               __args,&local_d8,(long *)&local_b8);
    ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
    emplace_back<std::shared_ptr<inja::BlockStatementNode>&>
              ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                *)&(*__args)->nodes,(shared_ptr<inja::BlockStatementNode> *)local_68);
    local_b8._M_dataplus._M_p = (pointer)local_68._0_8_;
    ::std::deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>>::
    emplace_back<inja::BlockStatementNode*>
              ((deque<inja::BlockStatementNode*,std::allocator<inja::BlockStatementNode*>> *)
               &this->block_statement_stack,(BlockStatementNode **)&local_b8);
    *__args = (BlockNode *)(local_68._0_8_ + 0x30);
    pVar22 = ::std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>>
             ::
             _M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<inja::BlockStatementNode>&>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<inja::BlockStatementNode>>>>
                         *)&pTVar21->block_storage,&local_d8,
                        (shared_ptr<inja::BlockStatementNode> *)local_68);
    if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      ::std::operator+(&local_98,"block with the name \'",&local_d8);
      plVar14 = (long *)::std::__cxx11::string::append((char *)&local_98);
      p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar14 + 2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar14 == p_Var17) {
        local_b8.field_2._M_allocated_capacity = (size_type)p_Var17->_vptr__Sp_counted_base;
        local_b8.field_2._8_8_ = plVar14[3];
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = (size_type)p_Var17->_vptr__Sp_counted_base;
        local_b8._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_b8._M_string_length = plVar14[1];
      *plVar14 = (long)p_Var17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      throw_parser_error(this,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        (ulong)(local_b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    if (this->have_peek_tok == true) {
      (this->tok).text._M_str = (this->peek_tok).text._M_str;
      uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
      sVar4 = (this->peek_tok).text._M_len;
      this_00->kind = (this->peek_tok).kind;
      *(undefined4 *)&this_00->field_0x4 = uVar8;
      (this->tok).text._M_len = sVar4;
      this->have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_b8,&this->lexer);
      (this->tok).text._M_str = (char *)local_b8.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_b8._M_dataplus._M_p;
      (this->tok).text._M_len = local_b8._M_string_length;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
      return true;
    }
    goto LAB_00162409;
  case 6:
    iVar13 = bcmp(__s1,"endfor",__n);
    if (iVar13 == 0) {
      ppFVar18 = (this->for_statement_stack).c.
                 super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppFVar18 ==
          (this->for_statement_stack).c.
          super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"endfor without matching for","");
        throw_parser_error(this,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          (ulong)(local_d8.field_2._M_allocated_capacity + 1));
        }
        ppFVar18 = (this->for_statement_stack).c.
                   super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      }
      if (ppFVar18 ==
          (this->for_statement_stack).c.
          super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppFVar18 = (this->for_statement_stack).c.
                   super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      if (this->have_peek_tok == true) {
        (this->tok).text._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        this_00->kind = (this->peek_tok).kind;
        *(undefined4 *)&this_00->field_0x4 = uVar8;
        (this->tok).text._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_d8,&this->lexer);
        (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
        *(pointer *)this_00 = local_d8._M_dataplus._M_p;
        (this->tok).text._M_len = local_d8._M_string_length;
      }
      this->current_block = ppFVar18[-1]->parent;
      std::deque<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>::pop_back
                (&(this->for_statement_stack).c);
      return true;
    }
    return false;
  case 7:
    iVar13 = bcmp(__s1,"include",__n);
    if (iVar13 == 0) {
      if (this->have_peek_tok == true) {
        (this->tok).text._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        this_00->kind = (this->peek_tok).kind;
        *(undefined4 *)&this_00->field_0x4 = uVar8;
        (this->tok).text._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_d8,&this->lexer);
        (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
        *(pointer *)this_00 = local_d8._M_dataplus._M_p;
        (this->tok).text._M_len = local_d8._M_string_length;
      }
      parse_filename_abi_cxx11_(&local_d8,this);
      add_to_template_storage(this,path,&local_d8);
      pBVar3 = this->current_block;
      local_98._M_dataplus._M_p =
           (this->tok).text._M_str + -(long)(local_78->content)._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<inja::IncludeStatementNode,std::allocator<inja::IncludeStatementNode>,std::__cxx11::string&,long>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length,
                 (IncludeStatementNode **)&local_b8,
                 (allocator<inja::IncludeStatementNode> *)local_68,&local_d8,(long *)&local_98);
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::IncludeStatementNode>>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&pBVar3->nodes,(shared_ptr<inja::IncludeStatementNode> *)&local_b8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
      }
      if (this->have_peek_tok != true) {
        Lexer::scan((Token *)&local_b8,&this->lexer);
        goto LAB_00161af4;
      }
LAB_00161acd:
      (this->tok).text._M_str = (this->peek_tok).text._M_str;
      uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
      sVar4 = (this->peek_tok).text._M_len;
      this_00->kind = (this->peek_tok).kind;
      *(undefined4 *)&this_00->field_0x4 = uVar8;
      (this->tok).text._M_len = sVar4;
      this->have_peek_tok = false;
    }
    else {
      if (*(int *)((long)__s1 + 3) != 0x73646e65 || *__s1 != 0x65747865) {
        return false;
      }
      if (this->have_peek_tok == true) {
        (this->tok).text._M_str = (this->peek_tok).text._M_str;
        uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
        sVar4 = (this->peek_tok).text._M_len;
        this_00->kind = (this->peek_tok).kind;
        *(undefined4 *)&this_00->field_0x4 = uVar8;
        (this->tok).text._M_len = sVar4;
        this->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)&local_d8,&this->lexer);
        (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
        *(pointer *)this_00 = local_d8._M_dataplus._M_p;
        (this->tok).text._M_len = local_d8._M_string_length;
      }
      parse_filename_abi_cxx11_(&local_d8,this);
      add_to_template_storage(this,path,&local_d8);
      pBVar3 = this->current_block;
      local_98._M_dataplus._M_p =
           (this->tok).text._M_str + -(long)(local_78->content)._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<inja::ExtendsStatementNode,std::allocator<inja::ExtendsStatementNode>,std::__cxx11::string&,long>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_string_length,
                 (ExtendsStatementNode **)&local_b8,
                 (allocator<inja::ExtendsStatementNode> *)local_68,&local_d8,(long *)&local_98);
      ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
      emplace_back<std::shared_ptr<inja::ExtendsStatementNode>>
                ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                  *)&pBVar3->nodes,(shared_ptr<inja::ExtendsStatementNode> *)&local_b8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
      }
      if (this->have_peek_tok == true) goto LAB_00161acd;
      Lexer::scan((Token *)&local_b8,&this->lexer);
LAB_00161af4:
      (this->tok).text._M_str = (char *)local_b8.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_b8._M_dataplus._M_p;
      (this->tok).text._M_len = local_b8._M_string_length;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
      return true;
    }
LAB_00162409:
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1));
    return true;
  case 8:
    iVar13 = bcmp(__s1,"endblock",__n);
    if (iVar13 != 0) {
      return false;
    }
    ppBVar19 = (this->block_statement_stack).c.
               super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppBVar19 ==
        (this->block_statement_stack).c.
        super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"endblock without matching block","");
      throw_parser_error(this,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        (ulong)(local_d8.field_2._M_allocated_capacity + 1));
      }
      ppBVar19 = (this->block_statement_stack).c.
                 super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    }
    if (ppBVar19 ==
        (this->block_statement_stack).c.
        super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppBVar19 = (this->block_statement_stack).c.
                 super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (this->have_peek_tok == true) {
      (this->tok).text._M_str = (this->peek_tok).text._M_str;
      uVar8 = *(undefined4 *)&(this->peek_tok).field_0x4;
      sVar4 = (this->peek_tok).text._M_len;
      this_00->kind = (this->peek_tok).kind;
      *(undefined4 *)&this_00->field_0x4 = uVar8;
      (this->tok).text._M_len = sVar4;
      this->have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_d8,&this->lexer);
      (this->tok).text._M_str = (char *)local_d8.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_d8._M_dataplus._M_p;
      (this->tok).text._M_len = local_d8._M_string_length;
    }
    this->current_block = ppBVar19[-1]->parent;
    std::deque<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>::pop_back
              (&(this->block_statement_stack).c);
    return true;
  }
  if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
  }
LAB_00162335:
  if (bVar12 != false) {
    return true;
  }
  return false;
}

Assistant:

bool parse_statement(Template& tmpl, Token::Kind closing, const std::filesystem::path& path) {
    if (tok.kind != Token::Kind::Id) {
      return false;
    }

    if (tok.text == static_cast<decltype(tok.text)>("if")) {
      get_next_token();

      auto if_statement_node = std::make_shared<IfStatementNode>(current_block, tok.text.data() - tmpl.content.c_str());
      current_block->nodes.emplace_back(if_statement_node);
      if_statement_stack.emplace(if_statement_node.get());
      current_block = &if_statement_node->true_statement;
      current_expression_list = &if_statement_node->condition;

      if (!parse_expression(tmpl, closing)) {
        return false;
      }
    } else if (tok.text == static_cast<decltype(tok.text)>("else")) {
      if (if_statement_stack.empty()) {
        throw_parser_error("else without matching if");
      }
      auto& if_statement_data = if_statement_stack.top();
      get_next_token();

      if_statement_data->has_false_statement = true;
      current_block = &if_statement_data->false_statement;

      // Chained else if
      if (tok.kind == Token::Kind::Id && tok.text == static_cast<decltype(tok.text)>("if")) {
        get_next_token();

        auto if_statement_node = std::make_shared<IfStatementNode>(true, current_block, tok.text.data() - tmpl.content.c_str());
        current_block->nodes.emplace_back(if_statement_node);
        if_statement_stack.emplace(if_statement_node.get());
        current_block = &if_statement_node->true_statement;
        current_expression_list = &if_statement_node->condition;

        if (!parse_expression(tmpl, closing)) {
          return false;
        }
      }
    } else if (tok.text == static_cast<decltype(tok.text)>("endif")) {
      if (if_statement_stack.empty()) {
        throw_parser_error("endif without matching if");
      }

      // Nested if statements
      while (if_statement_stack.top()->is_nested) {
        if_statement_stack.pop();
      }

      auto& if_statement_data = if_statement_stack.top();
      get_next_token();

      current_block = if_statement_data->parent;
      if_statement_stack.pop();
    } else if (tok.text == static_cast<decltype(tok.text)>("block")) {
      get_next_token();

      if (tok.kind != Token::Kind::Id) {
        throw_parser_error("expected block name, got '" + tok.describe() + "'");
      }

      const std::string block_name = static_cast<std::string>(tok.text);

      auto block_statement_node = std::make_shared<BlockStatementNode>(current_block, block_name, tok.text.data() - tmpl.content.c_str());
      current_block->nodes.emplace_back(block_statement_node);
      block_statement_stack.emplace(block_statement_node.get());
      current_block = &block_statement_node->block;
      auto success = tmpl.block_storage.emplace(block_name, block_statement_node);
      if (!success.second) {
        throw_parser_error("block with the name '" + block_name + "' does already exist");
      }

      get_next_token();
    } else if (tok.text == static_cast<decltype(tok.text)>("endblock")) {
      if (block_statement_stack.empty()) {
        throw_parser_error("endblock without matching block");
      }

      auto& block_statement_data = block_statement_stack.top();
      get_next_token();

      current_block = block_statement_data->parent;
      block_statement_stack.pop();
    } else if (tok.text == static_cast<decltype(tok.text)>("for")) {
      get_next_token();

      // options: for a in arr; for a, b in obj
      if (tok.kind != Token::Kind::Id) {
        throw_parser_error("expected id, got '" + tok.describe() + "'");
      }

      Token value_token = tok;
      get_next_token();

      // Object type
      std::shared_ptr<ForStatementNode> for_statement_node;
      if (tok.kind == Token::Kind::Comma) {
        get_next_token();
        if (tok.kind != Token::Kind::Id) {
          throw_parser_error("expected id, got '" + tok.describe() + "'");
        }

        const Token key_token = std::move(value_token);
        value_token = tok;
        get_next_token();

        for_statement_node = std::make_shared<ForObjectStatementNode>(static_cast<std::string>(key_token.text), static_cast<std::string>(value_token.text),
                                                                      current_block, tok.text.data() - tmpl.content.c_str());

        // Array type
      } else {
        for_statement_node =
            std::make_shared<ForArrayStatementNode>(static_cast<std::string>(value_token.text), current_block, tok.text.data() - tmpl.content.c_str());
      }

      current_block->nodes.emplace_back(for_statement_node);
      for_statement_stack.emplace(for_statement_node.get());
      current_block = &for_statement_node->body;
      current_expression_list = &for_statement_node->condition;

      if (tok.kind != Token::Kind::Id || tok.text != static_cast<decltype(tok.text)>("in")) {
        throw_parser_error("expected 'in', got '" + tok.describe() + "'");
      }
      get_next_token();

      if (!parse_expression(tmpl, closing)) {
        return false;
      }
    } else if (tok.text == static_cast<decltype(tok.text)>("endfor")) {
      if (for_statement_stack.empty()) {
        throw_parser_error("endfor without matching for");
      }

      auto& for_statement_data = for_statement_stack.top();
      get_next_token();

      current_block = for_statement_data->parent;
      for_statement_stack.pop();
    } else if (tok.text == static_cast<decltype(tok.text)>("include")) {
      get_next_token();

      std::string template_name = parse_filename();
      add_to_template_storage(path, template_name);

      current_block->nodes.emplace_back(std::make_shared<IncludeStatementNode>(template_name, tok.text.data() - tmpl.content.c_str()));

      get_next_token();
    } else if (tok.text == static_cast<decltype(tok.text)>("extends")) {
      get_next_token();

      std::string template_name = parse_filename();
      add_to_template_storage(path, template_name);

      current_block->nodes.emplace_back(std::make_shared<ExtendsStatementNode>(template_name, tok.text.data() - tmpl.content.c_str()));

      get_next_token();
    } else if (tok.text == static_cast<decltype(tok.text)>("set")) {
      get_next_token();

      if (tok.kind != Token::Kind::Id) {
        throw_parser_error("expected variable name, got '" + tok.describe() + "'");
      }

      const std::string key = static_cast<std::string>(tok.text);
      get_next_token();

      auto set_statement_node = std::make_shared<SetStatementNode>(key, tok.text.data() - tmpl.content.c_str());
      current_block->nodes.emplace_back(set_statement_node);
      current_expression_list = &set_statement_node->expression;

      if (tok.text != static_cast<decltype(tok.text)>("=")) {
        throw_parser_error("expected '=', got '" + tok.describe() + "'");
      }
      get_next_token();

      if (!parse_expression(tmpl, closing)) {
        return false;
      }
    } else {
      return false;
    }
    return true;
  }